

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_delete_win(osgen_win_t *win)

{
  int *in_RDI;
  osgen_gridwin_t *gwin;
  osgen_txtwin_t *twin;
  osgen_win_t *cur;
  osgen_win_t *prv;
  int *local_18;
  int *local_10;
  
  if (*(long *)(in_RDI + 4) != 0) {
    local_10 = (int *)0x0;
    for (local_18 = *(int **)(*(long *)(in_RDI + 4) + 0x18);
        local_18 != (int *)0x0 && local_18 != in_RDI; local_18 = *(int **)(local_18 + 2)) {
      local_10 = local_18;
    }
    if (local_18 != (int *)0x0) {
      if (local_10 == (int *)0x0) {
        *(undefined8 *)(*(long *)(in_RDI + 4) + 0x18) = *(undefined8 *)(in_RDI + 2);
      }
      else {
        *(undefined8 *)(local_10 + 2) = *(undefined8 *)(in_RDI + 2);
      }
    }
  }
  for (local_18 = *(int **)(in_RDI + 6); local_18 != (int *)0x0;
      local_18 = *(int **)((long)local_18 + 8)) {
    *(undefined8 *)((long)local_18 + 0x10) = 0;
  }
  if (*in_RDI == 1) {
    if (*(long *)(in_RDI + 0x20) != 0) {
      free(*(void **)(in_RDI + 0x20));
    }
    if (*(long *)(in_RDI + 0x26) != 0) {
      free(*(void **)(in_RDI + 0x26));
    }
  }
  else if (*in_RDI == 2) {
    if (*(long *)(in_RDI + 0x20) != 0) {
      free(*(void **)(in_RDI + 0x20));
    }
    if (*(long *)(in_RDI + 0x22) != 0) {
      free(*(void **)(in_RDI + 0x22));
    }
  }
  free(in_RDI);
  return;
}

Assistant:

static void osgen_delete_win(osgen_win_t *win)
{
    osgen_win_t *prv;
    osgen_win_t *cur;
    osgen_txtwin_t *twin;
    osgen_gridwin_t *gwin;

    /* if we have a parent, remove ourselves from our parent's child list */
    if (win->parent != 0)
    {
        /* scan our parent's child list */
        for (prv = 0, cur = win->parent->first_child ;
             cur != 0 && cur != win ;
             prv = cur, cur = cur->nxt) ;

        /* if we found it, unlink it */
        if (cur != 0)
        {
            /* set the previous item's forward pointer */
            if (prv == 0)
                win->parent->first_child = win->nxt;
            else
                prv->nxt = win->nxt;
        }
    }

    /* 
     *   Remove the parent reference from each child of this window.  We're
     *   going to be deleted, so we can't keep references from our children
     *   to us.  
     */
    for (cur = win->first_child ; cur != 0 ; cur = cur->nxt)
        cur->parent = 0;

    /* delete the window according to its type */
    switch(win->win_type)
    {
    case OS_BANNER_TYPE_TEXT:
        /* get the text window subclass data */
        twin = (osgen_txtwin_t *)win;

        /* delete its scrollback buffer, if it has one */
        if (twin->txtbuf != 0)
            osfree(twin->txtbuf);

        /* delete the line pointers */
        if (twin->line_ptr != 0)
            osfree(twin->line_ptr);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /* get the grid window subclass data */
        gwin = (osgen_gridwin_t *)win;

        /* delete the character and color arrays */
        if (gwin->grid_txt != 0)
            osfree(gwin->grid_txt);
        if (gwin->grid_color != 0)
            osfree(gwin->grid_color);
        break;
    }

    /* delete the window itself */
    osfree(win);
}